

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void duckdb_je_emap_do_assert_mapped(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  rtree_ctx_t *ctx;
  ulong uVar9;
  long lVar10;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar4 = edata->e_addr;
  uVar8 = (ulong)pvVar4 & 0xffffffffc0000000;
  uVar9 = (ulong)(((uint)((ulong)pvVar4 >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar9);
  uVar9 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar9);
  if (uVar9 != uVar8) {
    if (ctx->l2_cache[0].leafkey == uVar8) {
      prVar5 = ctx->l2_cache[0].leaf;
      ctx->l2_cache[0].leafkey = uVar9;
      ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
      *puVar1 = uVar8;
      puVar1[1] = (ulong)prVar5;
    }
    else {
      for (lVar10 = 0x118; lVar10 != 0x188; lVar10 = lVar10 + 0x10) {
        if (*(ulong *)((long)ctx->cache + lVar10 + -8) == uVar8) {
          uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar10);
          puVar2 = (undefined8 *)((long)ctx->cache + lVar10 + -0x18);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)ctx->cache + lVar10 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          *(ulong *)((long)ctx->cache + lVar10 + -0x18) = uVar9;
          *(ulong *)((long)(ctx->cache + -1) + lVar10) = puVar1[1];
          *puVar1 = uVar8;
          puVar1[1] = uVar6;
          return;
        }
      }
      duckdb_je_rtree_leaf_elm_lookup_hard
                (tsdn,&emap->rtree,ctx,(ulong)pvVar4 & 0xfffffffffffff000,true,false);
    }
  }
  return;
}

Assistant:

void
emap_do_assert_mapped(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	EMAP_DECLARE_RTREE_CTX;

	rtree_contents_t contents = rtree_read(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata));
	assert(contents.edata == edata);
	assert(contents.metadata.is_head == edata_is_head_get(edata));
	assert(contents.metadata.state == edata_state_get(edata));
}